

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprMightBeIndexed(SrcList *pFrom,int op,Bitmask mPrereq,Expr *pExpr,int *piCur,int *piColumn)

{
  int iTab;
  int iVar1;
  int local_4c;
  int iCur;
  int i;
  Index *pIdx;
  int *piColumn_local;
  int *piCur_local;
  Expr *pExpr_local;
  Bitmask mPrereq_local;
  int op_local;
  SrcList *pFrom_local;
  
  piCur_local = (int *)pExpr;
  if (((pExpr->op == 0x9e) && (0x25 < op)) && (op < 0x2a)) {
    piCur_local = (int *)((pExpr->x).pList)->a->pExpr;
  }
  if ((char)*piCur_local == -0x68) {
    *piCur = piCur_local[0xb];
    *piColumn = (int)(short)piCur_local[0xc];
    pFrom_local._4_4_ = 1;
  }
  else if (mPrereq == 0) {
    pFrom_local._4_4_ = 0;
  }
  else if ((mPrereq & mPrereq - 1) == 0) {
    local_4c = 0;
    for (pExpr_local = (Expr *)mPrereq; (Expr *)&DAT_00000001 < pExpr_local;
        pExpr_local = (Expr *)((ulong)pExpr_local >> 1)) {
      local_4c = local_4c + 1;
    }
    iTab = pFrom->a[local_4c].iCursor;
    for (_iCur = (pFrom->a[local_4c].pTab)->pIndex; _iCur != (Index *)0x0; _iCur = _iCur->pNext) {
      if (_iCur->aColExpr != (ExprList *)0x0) {
        for (local_4c = 0; local_4c < (int)(uint)_iCur->nKeyCol; local_4c = local_4c + 1) {
          if ((_iCur->aiColumn[local_4c] == -2) &&
             (iVar1 = sqlite3ExprCompare((Expr *)piCur_local,_iCur->aColExpr->a[local_4c].pExpr,iTab
                                        ), iVar1 == 0)) {
            *piCur = iTab;
            *piColumn = -2;
            return 1;
          }
        }
      }
    }
    pFrom_local._4_4_ = 0;
  }
  else {
    pFrom_local._4_4_ = 0;
  }
  return pFrom_local._4_4_;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  int op,                /* The specific comparison operator */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  Expr *pExpr,           /* An operand of a comparison operator */
  int *piCur,            /* Write the referenced table cursor number here */
  int *piColumn          /* Write the referenced table column number here */
){
  Index *pIdx;
  int i;
  int iCur;

  /* If this expression is a vector to the left or right of a 
  ** inequality constraint (>, <, >= or <=), perform the processing 
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    *piCur = pExpr->iTable;
    *piColumn = pExpr->iColumn;
    return 1;
  }
  if( mPrereq==0 ) return 0;                 /* No table references */
  if( (mPrereq&(mPrereq-1))!=0 ) return 0;   /* Refs more than one table */
  for(i=0; mPrereq>1; i++, mPrereq>>=1){}
  iCur = pFrom->a[i].iCursor;
  for(pIdx=pFrom->a[i].pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->aColExpr==0 ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
      if( sqlite3ExprCompare(pExpr, pIdx->aColExpr->a[i].pExpr, iCur)==0 ){
        *piCur = iCur;
        *piColumn = XN_EXPR;
        return 1;
      }
    }
  }
  return 0;
}